

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_parsedUnitsRequiringImports_Test::TestBody(Units_parsedUnitsRequiringImports_Test *this)

{
  char cVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ModelPtr model;
  ParserPtr parser;
  long *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  AssertionResult local_80;
  long local_70 [2];
  AssertHelper local_60 [8];
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"requires_imports.cellml","");
  fileContents((string *)&local_80);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_58 = (long *)0x3;
  local_90 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(3)","model->unitsCount()",(unsigned_long *)&local_58,
             (unsigned_long *)&local_90);
  if ((string)local_80.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9ba,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"grandpa","");
  libcellml::Model::units((string *)&local_90);
  uVar2 = libcellml::ImportedEntity::isImport();
  local_58 = (long *)(CONCAT71(local_58._1_7_,uVar2) ^ 1);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_58,"model->units(\"grandpa\")->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9bb,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"grandpa","");
  libcellml::Model::units((string *)&local_90);
  uVar2 = libcellml::Units::requiresImports();
  local_58 = (long *)CONCAT71(local_58._1_7_,uVar2);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_58,"model->units(\"grandpa\")->requiresImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9bc,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, parsedUnitsRequiringImports)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("requires_imports.cellml"));

    // When parsing a model it's hard to know whether the units it uses are imported
    // or not if the import is in a child units item.  Using the Units::requiresImports()
    // function should tell us.

    EXPECT_EQ(size_t(3), model->unitsCount());
    EXPECT_FALSE(model->units("grandpa")->isImport());
    EXPECT_TRUE(model->units("grandpa")->requiresImports());
}